

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

double get_removal_time(int mode,int num_decoded_frame,int decoder_buffer_delay,
                       FRAME_BUFFER *frame_buffer_pool,double current_time)

{
  int i;
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  if (mode == 1) {
    return -1.0;
  }
  if (num_decoded_frame == 0) {
    return (double)decoder_buffer_delay / 90000.0;
  }
  uVar1 = 0;
  dVar2 = 1e+16;
  do {
    if (uVar1 == 10) {
LAB_001b5a03:
      return (double)(~-(ulong)(dVar2 < 1e+16) & 0xbff0000000000000 |
                     (ulong)dVar2 & -(ulong)(dVar2 < 1e+16));
    }
    dVar3 = dVar2;
    if (frame_buffer_pool->decoder_ref_count == 0) {
      if (frame_buffer_pool->player_ref_count == 0) {
        if (uVar1 < 10) {
          return current_time;
        }
        goto LAB_001b5a03;
      }
      dVar3 = frame_buffer_pool->presentation_time;
      if (dVar3 < 0.0 || dVar2 <= dVar3) {
        dVar3 = dVar2;
      }
    }
    uVar1 = uVar1 + 1;
    frame_buffer_pool = frame_buffer_pool + 1;
    dVar2 = dVar3;
  } while( true );
}

Assistant:

static double get_removal_time(int mode, int num_decoded_frame,
                               int decoder_buffer_delay,
                               const FRAME_BUFFER *frame_buffer_pool,
                               double current_time) {
  if (mode == SCHEDULE_MODE) {
    assert(0 && "SCHEDULE_MODE IS NOT SUPPORTED YET");
    return INVALID_TIME;
  } else {
    return time_next_buffer_is_free(num_decoded_frame, decoder_buffer_delay,
                                    frame_buffer_pool, current_time);
  }
}